

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O2

bool Js::CompoundString::TryAppendGeneric<Js::CompoundString>
               (JavascriptString *s,CharCount appendCharLength,CompoundString *toString)

{
  code *pcVar1;
  bool bVar2;
  charcount_t cVar3;
  CharCount CVar4;
  CharCount CVar5;
  undefined4 *puVar6;
  JavascriptString *ptr;
  Type *pTVar7;
  
  if (s == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x36b,"(s)","s");
    if (!bVar2) goto LAB_0098f78f;
    *puVar6 = 0;
  }
  cVar3 = JavascriptString::GetLength(s);
  if (cVar3 != appendCharLength) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x36c,"(appendCharLength == s->GetLength())",
                                "appendCharLength == s->GetLength()");
    if (!bVar2) goto LAB_0098f78f;
    *puVar6 = 0;
  }
  if (toString == (CompoundString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x36d,"(toString)","toString");
    if (!bVar2) goto LAB_0098f78f;
    *puVar6 = 0;
  }
  bVar2 = JavascriptString::IsFinalized((JavascriptString *)toString);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x36e,"(!toString->IsFinalized())","!toString->IsFinalized()");
    if (!bVar2) goto LAB_0098f78f;
    *puVar6 = 0;
  }
  bVar2 = OwnsLastBlock(toString);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x36f,"(toString->OwnsLastBlock())","toString->OwnsLastBlock()");
    if (!bVar2) goto LAB_0098f78f;
    *puVar6 = 0;
  }
  bVar2 = HasOnlyDirectChars(toString);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x370,"(!toString->HasOnlyDirectChars())",
                                "!toString->HasOnlyDirectChars()");
    if (!bVar2) {
LAB_0098f78f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  CVar4 = LastBlockPointerLength(toString);
  CVar5 = LastBlockPointerCapacity(toString);
  if (CVar4 < CVar5) {
    ptr = GetImmutableOrScriptUnreferencedString(s);
    pTVar7 = LastBlockPointers(toString);
    Memory::WriteBarrierPtr<void>::WriteBarrierSet(pTVar7 + CVar4,ptr);
    cVar3 = JavascriptString::GetLength((JavascriptString *)toString);
    JavascriptString::SetLength((JavascriptString *)toString,appendCharLength + cVar3);
    SetLastBlockPointerLength(toString,CVar4 + 1);
  }
  return CVar4 < CVar5;
}

Assistant:

inline bool CompoundString::TryAppendGeneric(
        JavascriptString *const s,
        const CharCount appendCharLength,
        String *const toString)
    {
        Assert(s);
        Assert(appendCharLength == s->GetLength());
        Assert(toString);
        Assert(!toString->IsFinalized());
        Assert(toString->OwnsLastBlock());
        Assert(!toString->HasOnlyDirectChars());

        const CharCount blockPointerLength = toString->LastBlockPointerLength();
        if(blockPointerLength < toString->LastBlockPointerCapacity())
        {
            toString->LastBlockPointers()[blockPointerLength] = GetImmutableOrScriptUnreferencedString(s);
            toString->SetLength(toString->GetLength() + appendCharLength);
            toString->SetLastBlockPointerLength(blockPointerLength + 1);
            return true;
        }
        return false;
    }